

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateForEachNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)

{
  SyToken *pSVar1;
  sxi32 sVar2;
  sxu32 nLine;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (pRoot->xCode != jx9CompileVariable) {
    pSVar1 = pRoot->pStart;
    if (pSVar1 == (SyToken *)0x0) {
      nLine = 0;
    }
    else {
      nLine = pSVar1->nLine;
    }
    sVar2 = jx9GenCompileError(pGen,1,nLine,"foreach: Expecting a variable name",in_R8,in_R9,pSVar1)
    ;
    return sVar2 == -10 ^ 0xfffffff7;
  }
  return 0;
}

Assistant:

static sxi32 GenStateForEachNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)
{
	sxi32 rc = SXRET_OK; /* Assume a valid expression tree */
	if( pRoot->xCode != jx9CompileVariable ){
		/* Unexpected expression */
		rc = jx9GenCompileError(&(*pGen),
			E_ERROR,
			pRoot->pStart? pRoot->pStart->nLine : 0, 
			"foreach: Expecting a variable name"
			);
		if( rc != SXERR_ABORT ){
			rc = SXERR_INVALID;
		}
	}
	return rc;
}